

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vec4 *result)

{
  int size;
  int size_00;
  undefined1 auVar1 [16];
  int c;
  bool bVar2;
  TextureChannelClass TVar3;
  int c_00;
  uint x0;
  uint x1;
  int y0;
  int y1;
  int iVar4;
  uint uVar5;
  Vec2 *yBounds;
  Vec4 *result_00;
  int c_01;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec2 vBounds;
  Vec2 uBounds;
  ColorQuad quad;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar6 = floorf(uBounds.m_data[0] + -0.5);
  fVar7 = floorf(uBounds.m_data[1] + -0.5);
  fVar8 = floorf(vBounds.m_data[0] + -0.5);
  fVar9 = floorf(vBounds.m_data[1] + -0.5);
  size = (level->m_size).m_data[0];
  size_00 = (level->m_size).m_data[1];
  TVar3 = getTextureChannelClass((level->m_format).type);
  if (TVar3 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    computeBilinearSearchStepForSnorm(prec);
  }
  else if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    computeBilinearSearchStepForUnorm(prec);
  }
  if ((int)fVar8 <= (int)fVar9) {
    c = (int)fVar8;
    do {
      c_00 = c + 1;
      c_01 = (int)fVar6;
      while (c_01 <= (int)fVar7) {
        iVar4 = (int)fVar6;
        x0 = TexVerifierUtil::wrap(sampler->wrapS,c_01,size);
        x1 = TexVerifierUtil::wrap(sampler->wrapS,c_01 + 1,size);
        y0 = TexVerifierUtil::wrap(sampler->wrapT,c,size_00);
        y1 = TexVerifierUtil::wrap(sampler->wrapT,c_00,size_00);
        fVar10 = (uBounds.m_data[0] + -0.5) - (float)c_01;
        auVar1._4_4_ = -(uint)((vBounds.m_data[1] + -0.5) - (float)c < 0.0);
        auVar1._0_4_ = -(uint)((vBounds.m_data[0] + -0.5) - (float)c < 0.0);
        auVar1._8_4_ = -(uint)(fVar10 < 0.0);
        auVar1._12_4_ = -(uint)((uBounds.m_data[1] + -0.5) - (float)c_01 < 0.0);
        uVar5 = movmskps(iVar4,auVar1);
        fVar8 = 0.0;
        if (((uVar5 & 4) == 0) && (fVar8 = 1.0, fVar10 <= 1.0)) {
          fVar8 = fVar10;
        }
        quad.p11.m_data[0] = 0.0;
        quad.p11.m_data[1] = 0.0;
        quad.p11.m_data[2] = 0.0;
        quad.p11.m_data[3] = 0.0;
        quad.p10.m_data[0] = 0.0;
        quad.p10.m_data[1] = 0.0;
        quad.p10.m_data[2] = 0.0;
        quad.p10.m_data[3] = 0.0;
        quad.p01.m_data[0] = 0.0;
        quad.p01.m_data[1] = 0.0;
        quad.p01.m_data[2] = 0.0;
        quad.p01.m_data[3] = 0.0;
        quad.p00.m_data[0] = 0.0;
        quad.p00.m_data[1] = 0.0;
        quad.p00.m_data[2] = 0.0;
        quad.p00.m_data[3] = 0.0;
        yBounds = (Vec2 *)(ulong)x0;
        result_00 = (Vec4 *)(ulong)x1;
        lookupQuad(&quad,level,sampler,x0,x1,y0,y1,coordZ);
        if (TVar3 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          computeBilinearSearchStepFromFloatQuad(prec,&quad);
        }
        bVar2 = isBilinearRangeValid(prec,&quad,(Vec2 *)result,yBounds,fVar8,result_00);
        c_01 = c_01 + 1;
        if (bVar2) {
          return true;
        }
      }
      c = c_00;
    } while (c_00 <= (int)fVar9);
  }
  return false;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const Vec2&							coord,
								const int							coordZ,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int					minJ			= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int					maxJ			= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int					w				= level.getWidth();
	const int					h				= level.getHeight();

	const TextureChannelClass	texClass		= getTextureChannelClass(level.getFormat().type);
	float						searchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			ColorQuad quad;
			lookupQuad(quad, level, sampler, x0, x1, y0, y1, coordZ);

			if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
				searchStep = computeBilinearSearchStepFromFloatQuad(prec, quad);

			if (isBilinearRangeValid(prec, quad, Vec2(minA, maxA), Vec2(minB, maxB), searchStep, result))
				return true;
		}
	}

	return false;
}